

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<512U,_unsigned_short,_void,_false> * __thiscall
math::wide_integer::uintwide_t<512U,_unsigned_short,_void,_false>::operator*=
          (uintwide_t<512U,_unsigned_short,_void,_false> *this,
          uintwide_t<512U,_unsigned_short,_void,_false> *other)

{
  uintwide_t<512U,_unsigned_short,_void,_false> other_as_self_copy;
  uintwide_t<512U,_unsigned_short,_void,_false> local_48;
  
  if (this == other) {
    local_48.values.super_array<unsigned_short,_32UL>.elems._0_8_ =
         *(undefined8 *)(other->values).super_array<unsigned_short,_32UL>.elems;
    local_48.values.super_array<unsigned_short,_32UL>.elems._8_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_short,_32UL>.elems + 4);
    local_48.values.super_array<unsigned_short,_32UL>.elems._16_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_short,_32UL>.elems + 8);
    local_48.values.super_array<unsigned_short,_32UL>.elems._24_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_short,_32UL>.elems + 0xc);
    local_48.values.super_array<unsigned_short,_32UL>.elems._32_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_short,_32UL>.elems + 0x10);
    local_48.values.super_array<unsigned_short,_32UL>.elems._40_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_short,_32UL>.elems + 0x14);
    local_48.values.super_array<unsigned_short,_32UL>.elems._48_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_short,_32UL>.elems + 0x18);
    local_48.values.super_array<unsigned_short,_32UL>.elems._56_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_short,_32UL>.elems + 0x1c);
    other = &local_48;
  }
  void_math::wide_integer::uintwide_t<512u,unsigned_short,void,false>::eval_mul_unary<512u>(math::
  wide_integer::uintwide_t<512u,unsigned_short,void,false>&,math::wide_integer::
  uintwide_t<512u,unsigned_short,void,false>const&,std::enable_if<((512u)/std::
  numeric_limits<unsigned_short>::digits)<math::wide_integer::
  uintwide_t<512u,unsigned_short,void,false>::number_of_limbs_karatsuba_threshold,void>::type__
            (this,other,
             (enable_if_t<((512U___std::numeric_limits<unsigned_short>::digits)_<_number_of_limbs_karatsuba_threshold)>
              *)0x0);
  return this;
}

Assistant:

constexpr auto operator*=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t other_as_self_copy(other); // NOLINT(performance-unnecessary-copy-initialization)

        eval_mul_unary(*this, other_as_self_copy);
      }
      else
      {
        eval_mul_unary(*this, other);
      }

      return *this;
    }